

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virgo.h
# Opt level: O0

void __thiscall virgo::Chessboard::Chessboard(Chessboard *this)

{
  byte bVar1;
  pair<virgo::Piece,_virgo::Player> *local_68;
  Player local_60;
  Piece local_5c;
  pair<virgo::Piece,_virgo::Player> local_58;
  Player local_50;
  Piece local_4c;
  pair<virgo::Piece,_virgo::Player> local_48;
  pair<virgo::Piece,_virgo::Player> local_40;
  uint64_t board;
  Player local_30;
  int i;
  pair<virgo::Piece,_virgo::Player> local_28;
  int local_20;
  int s;
  Chessboard *local_10;
  Chessboard *this_local;
  
  local_10 = this;
  std::vector<virgo::HistoryMove,_std::allocator<virgo::HistoryMove>_>::vector(&this->history);
  local_68 = this->squares;
  do {
    std::pair<virgo::Piece,_virgo::Player>::pair<virgo::Piece,_virgo::Player,_true>(local_68);
    local_68 = local_68 + 1;
  } while ((Chessboard *)local_68 != this + 1);
  this->castling_perm = '\0';
  this->fifty_mv_counter = '\0';
  this->next = WHITE;
  this->enpassant = 0x40;
  this->king_position[0] = 0x3c;
  this->king_position[1] = 4;
  this->all = 0xffff00000000ffff;
  this->pieces[0][0] = 0xff000000000000;
  this->pieces[0][1] = 0x8100000000000000;
  this->pieces[0][2] = 0x4200000000000000;
  this->pieces[0][3] = 0x2400000000000000;
  this->pieces[0][4] = 0x800000000000000;
  this->pieces[0][5] = 0x1000000000000000;
  this->pieces[1][0] = 0xff00;
  this->pieces[1][1] = 0x81;
  this->pieces[1][2] = 0x42;
  this->pieces[1][3] = 0x24;
  this->pieces[1][4] = 8;
  this->pieces[1][5] = 0x10;
  for (local_20 = 0; local_20 < 0x40; local_20 = local_20 + 1) {
    i = 6;
    local_30 = BLACK;
    local_28 = std::make_pair<virgo::Piece,virgo::Player>((Piece *)&i,&local_30);
    std::pair<virgo::Piece,_virgo::Player>::operator=(this->squares + local_20,&local_28);
  }
  for (board._4_4_ = PAWN; (int)board._4_4_ < 6; board._4_4_ = board._4_4_ + ROOK) {
    for (local_40 = *(pair<virgo::Piece,_virgo::Player> *)(this->pieces[0] + (int)board._4_4_);
        local_40 != (pair<virgo::Piece,_virgo::Player>)0x0;
        local_40 = (pair<virgo::Piece,_virgo::Player>)((long)local_40 - 1U & (ulong)local_40)) {
      local_4c = board._4_4_;
      local_50 = BLACK;
      local_48 = std::make_pair<virgo::Piece,virgo::Player>(&local_4c,&local_50);
      bVar1 = anon_unknown.dwarf_23aa6::bit::pop_lsb_index((uint64_t *)&local_40);
      std::pair<virgo::Piece,_virgo::Player>::operator=(this->squares + bVar1,&local_48);
    }
    for (local_40 = this->squares[(long)(int)board._4_4_ + -6];
        local_40 != (pair<virgo::Piece,_virgo::Player>)0x0;
        local_40 = (pair<virgo::Piece,_virgo::Player>)((long)local_40 - 1U & (ulong)local_40)) {
      local_5c = board._4_4_;
      local_60 = WHITE;
      local_58 = std::make_pair<virgo::Piece,virgo::Player>(&local_5c,&local_60);
      bVar1 = anon_unknown.dwarf_23aa6::bit::pop_lsb_index((uint64_t *)&local_40);
      std::pair<virgo::Piece,_virgo::Player>::operator=(this->squares + bVar1,&local_58);
    }
  }
  return;
}

Assistant:

Chessboard::Chessboard() {
        // Initial chessboard setup
        this->castling_perm = 0x00;
        this->fifty_mv_counter = 0;
        this->next = WHITE;
        this->enpassant = INVALID;
        this->king_position[0] = e8;
        this->king_position[1] = e1;

        // Set chess starting position
        this->all = 0xffff00000000ffff;

        // Set black pieces
        this->pieces[0][PAWN] = 0x00ff000000000000; // Pawns
        this->pieces[0][ROOK] = 0x8100000000000000; // Rooks
        this->pieces[0][KNIGHT] = 0x4200000000000000; // Knights
        this->pieces[0][BISHOP] = 0x2400000000000000; // Bishops
        this->pieces[0][KING] = 0x0800000000000000; // King
        this->pieces[0][QUEEN] = 0x1000000000000000; // Queen

        // Set white pieces
        this->pieces[1][PAWN] = 0x000000000000ff00; // Pawns
        this->pieces[1][ROOK] = 0x0000000000000081; // Rooks
        this->pieces[1][KNIGHT] = 0x0000000000000042; // Knights
        this->pieces[1][BISHOP] = 0x0000000000000024; // Bishops
        this->pieces[1][KING] = 0x0000000000000008; // King
        this->pieces[1][QUEEN] = 0x0000000000000010; // Queen

        // Fill with empty values
        for(int s = a1; s <= h8; s++) {
            this->squares[s] = std::make_pair(EMPTY, BLACK);
        }

        // Set every pair which has a piece on the corresponding square index
        for(int i = PAWN; i <= QUEEN; i++) {
            uint64_t board = this->pieces[BLACK][i];
            while(board) {
                this->squares[bit::pop_lsb_index(board)] = std::make_pair(static_cast<Piece>(i), BLACK);
                board &= (board-1);
            }
            board = this->pieces[WHITE][i];
            while(board) {
                this->squares[bit::pop_lsb_index(board)] = std::make_pair(static_cast<Piece>(i), WHITE);
                board &= (board-1);
            }
        }
    }